

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

bool __thiscall wasm::EffectAnalyzer::hasAnything(EffectAnalyzer *this)

{
  bool bVar1;
  undefined1 local_11;
  EffectAnalyzer *this_local;
  
  bVar1 = hasSideEffects(this);
  local_11 = true;
  if (!bVar1) {
    bVar1 = accessesLocal(this);
    local_11 = true;
    if (!bVar1) {
      local_11 = readsMutableGlobalState(this);
    }
  }
  return local_11;
}

Assistant:

bool hasAnything() const {
    return hasSideEffects() || accessesLocal() || readsMutableGlobalState();
  }